

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O0

h__Writer * __thiscall AS_02::PCM::MXFWriter::h__Writer::Finalize(h__Writer *this)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  undefined1 local_108 [248];
  h__Writer *this_local;
  Result_t *result;
  
  this_local = this;
  bVar1 = ASDCP::MXF::h__WriterState::Test_RUNNING((h__WriterState *)(in_RSI + 0x370));
  if (bVar1) {
    ASDCP::MXF::h__WriterState::Goto_FINAL((h__WriterState *)(local_108 + 0x88));
    Kumu::Result_t::~Result_t((Result_t *)(local_108 + 0x88));
    local_108[0x87] = 0;
    MXF::CalcSampleSize(*(WaveAudioDescriptor **)(in_RSI + 0x5c0));
    h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>::FinalizeClip
              (&this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>,(ui32_t)in_RSI);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      local_108._104_8_ = ZEXT48(*(uint *)(in_RSI + 0x338));
      *(uint *)(in_RSI + 0x598) = *(uint *)(in_RSI + 0x338);
      ASDCP::MXF::optional_property<unsigned_long_long>::operator=
                ((optional_property<unsigned_long_long> *)(*(long *)(in_RSI + 0x5c0) + 0xf8),
                 (unsigned_long_long *)(local_108 + 0x68));
      h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>::WriteAS02Footer
                ((h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR> *)local_108);
      Kumu::Result_t::~Result_t((Result_t *)local_108);
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::h__Writer::Finalize()
{
  if ( ! m_State.Test_RUNNING() )
    return RESULT_STATE;

  m_State.Goto_FINAL();

  Result_t result = FinalizeClip(AS_02::MXF::CalcSampleSize(*m_WaveAudioDescriptor));

  if ( KM_SUCCESS(result) )
    {
      m_WaveAudioDescriptor->ContainerDuration = m_IndexWriter.m_Duration = m_FramesWritten;
      WriteAS02Footer();
    }

  return result;
}